

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O1

void __thiscall
sf::RenderTarget::draw
          (RenderTarget *this,VertexBuffer *vertexBuffer,size_t firstVertex,size_t vertexCount,
          RenderStates *states)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  PrimitiveType PVar4;
  size_t sVar5;
  ostream *poVar6;
  socklen_t __len;
  socklen_t __len_00;
  sockaddr *psVar7;
  ulong uVar8;
  
  bVar1 = VertexBuffer::isAvailable();
  if (!bVar1) {
    poVar6 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"sf::VertexBuffer is not available, drawing skipped",0x32);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    return;
  }
  sVar5 = VertexBuffer::getVertexCount(vertexBuffer);
  if (firstVertex <= sVar5) {
    sVar5 = VertexBuffer::getVertexCount(vertexBuffer);
    uVar8 = sVar5 - firstVertex;
    if (vertexCount <= sVar5 - firstVertex) {
      uVar8 = vertexCount;
    }
    if ((uVar8 != 0) && (uVar2 = VertexBuffer::getNativeHandle(vertexBuffer), uVar2 != 0)) {
      bVar1 = anon_unknown.dwarf_86b03::isActive(this->m_id);
      if ((!bVar1) && (iVar3 = (*this->_vptr_RenderTarget[3])(this), (char)iVar3 == '\0')) {
        return;
      }
      psVar7 = (sockaddr *)0x0;
      setupDraw(this,false,states);
      VertexBuffer::bind((int)vertexBuffer,psVar7,__len);
      if (((this->m_cache).enable != true) || ((this->m_cache).texCoordsArrayEnabled == false)) {
        glEnableClientState(0x8078);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTarget.cpp"
                           ,0x173,"glEnableClientState(GL_TEXTURE_COORD_ARRAY)");
      }
      glVertexPointer(2,0x1406,0x14,0);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTarget.cpp"
                         ,0x175,
                         "glVertexPointer(2, GL_FLOAT, sizeof(Vertex), reinterpret_cast<const void*>(0))"
                        );
      glColorPointer(4,0x1401,0x14,8);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTarget.cpp"
                         ,0x176,
                         "glColorPointer(4, GL_UNSIGNED_BYTE, sizeof(Vertex), reinterpret_cast<const void*>(8))"
                        );
      glTexCoordPointer(2,0x1406,0x14,0xc);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTarget.cpp"
                         ,0x177,
                         "glTexCoordPointer(2, GL_FLOAT, sizeof(Vertex), reinterpret_cast<const void*>(12))"
                        );
      PVar4 = VertexBuffer::getPrimitiveType(vertexBuffer);
      glDrawArrays(drawPrimitives::modes[PVar4],firstVertex & 0xffffffff,uVar8 & 0xffffffff);
      psVar7 = (sockaddr *)0x2c7;
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTarget.cpp"
                         ,0x2c7,
                         "glDrawArrays(mode, static_cast<GLint>(firstVertex), static_cast<GLsizei>(vertexCount))"
                        );
      VertexBuffer::bind(0,psVar7,__len_00);
      cleanupDraw(this,states);
      (this->m_cache).texCoordsArrayEnabled = true;
      (this->m_cache).useVertexCache = false;
    }
  }
  return;
}

Assistant:

void RenderTarget::draw(const VertexBuffer& vertexBuffer, std::size_t firstVertex,
                        std::size_t vertexCount, const RenderStates& states)
{
    // VertexBuffer not supported?
    if (!VertexBuffer::isAvailable())
    {
        err() << "sf::VertexBuffer is not available, drawing skipped" << std::endl;
        return;
    }

    // Sanity check
    if (firstVertex > vertexBuffer.getVertexCount())
        return;

    // Clamp vertexCount to something that makes sense
    vertexCount = std::min(vertexCount, vertexBuffer.getVertexCount() - firstVertex);

    // Nothing to draw?
    if (!vertexCount || !vertexBuffer.getNativeHandle())
        return;

    // GL_QUADS is unavailable on OpenGL ES
    #ifdef SFML_OPENGL_ES
        if (vertexBuffer.getPrimitiveType() == Quads)
        {
            err() << "sf::Quads primitive type is not supported on OpenGL ES platforms, drawing skipped" << std::endl;
            return;
        }
    #endif

    if (isActive(m_id) || setActive(true))
    {
        setupDraw(false, states);

        // Bind vertex buffer
        VertexBuffer::bind(&vertexBuffer);

        // Always enable texture coordinates
        if (!m_cache.enable || !m_cache.texCoordsArrayEnabled)
            glCheck(glEnableClientState(GL_TEXTURE_COORD_ARRAY));

        glCheck(glVertexPointer(2, GL_FLOAT, sizeof(Vertex), reinterpret_cast<const void*>(0)));
        glCheck(glColorPointer(4, GL_UNSIGNED_BYTE, sizeof(Vertex), reinterpret_cast<const void*>(8)));
        glCheck(glTexCoordPointer(2, GL_FLOAT, sizeof(Vertex), reinterpret_cast<const void*>(12)));

        drawPrimitives(vertexBuffer.getPrimitiveType(), firstVertex, vertexCount);

        // Unbind vertex buffer
        VertexBuffer::bind(NULL);

        cleanupDraw(states);

        // Update the cache
        m_cache.useVertexCache = false;
        m_cache.texCoordsArrayEnabled = true;
    }
}